

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::Clone
          (TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  TPZBlockDiagonalStructMatrix
            ((TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBlockDiagonalStructMatrix<TVar,TPar>::Clone(){
    return new TPZBlockDiagonalStructMatrix(*this);
}